

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecBit.h
# Opt level: O2

void Vec_BitGrow(Vec_Bit_t *p,int nCapMin)

{
  int *piVar1;
  ulong __size;
  int iVar2;
  
  if (p->nCap < nCapMin) {
    iVar2 = (((uint)nCapMin >> 5) + 1) - (uint)((nCapMin & 0x1fU) == 0);
    __size = (ulong)(uint)(iVar2 * 4);
    if (p->pArray == (int *)0x0) {
      piVar1 = (int *)malloc(__size);
    }
    else {
      piVar1 = (int *)realloc(p->pArray,__size);
    }
    p->pArray = piVar1;
    if (piVar1 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecBit.h"
                    ,0x163,"void Vec_BitGrow(Vec_Bit_t *, int)");
    }
    p->nCap = iVar2 * 0x20;
  }
  return;
}

Assistant:

static inline void Vec_BitGrow( Vec_Bit_t * p, int nCapMin )
{
    if ( p->nCap >= nCapMin )
        return;
    nCapMin = (nCapMin >> 5) + ((nCapMin & 31) > 0);
    p->pArray = ABC_REALLOC( int, p->pArray, nCapMin ); 
    assert( p->pArray );
    p->nCap   = nCapMin * 32;
}